

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.c
# Opt level: O0

int yaml_emitter_emit_node
              (yaml_emitter_t *emitter,yaml_event_t *event,int root,int sequence,int mapping,
              int simple_key)

{
  int simple_key_local;
  int mapping_local;
  int sequence_local;
  int root_local;
  yaml_event_t *event_local;
  yaml_emitter_t *emitter_local;
  
  emitter->root_context = root;
  emitter->sequence_context = sequence;
  emitter->mapping_context = mapping;
  emitter->simple_key_context = simple_key;
  switch(event->type) {
  case YAML_ALIAS_EVENT:
    emitter_local._4_4_ = yaml_emitter_emit_alias(emitter,event);
    break;
  case YAML_SCALAR_EVENT:
    emitter_local._4_4_ = yaml_emitter_emit_scalar(emitter,event);
    break;
  case YAML_SEQUENCE_START_EVENT:
    emitter_local._4_4_ = yaml_emitter_emit_sequence_start(emitter,event);
    break;
  default:
    emitter_local._4_4_ =
         yaml_emitter_set_emitter_error
                   (emitter,"expected SCALAR, SEQUENCE-START, MAPPING-START, or ALIAS");
    break;
  case YAML_MAPPING_START_EVENT:
    emitter_local._4_4_ = yaml_emitter_emit_mapping_start(emitter,event);
  }
  return emitter_local._4_4_;
}

Assistant:

static int
yaml_emitter_emit_node(yaml_emitter_t *emitter, yaml_event_t *event,
        int root, int sequence, int mapping, int simple_key)
{
    emitter->root_context = root;
    emitter->sequence_context = sequence;
    emitter->mapping_context = mapping;
    emitter->simple_key_context = simple_key;

    switch (event->type)
    {
        case YAML_ALIAS_EVENT:
            return yaml_emitter_emit_alias(emitter, event);

        case YAML_SCALAR_EVENT:
            return yaml_emitter_emit_scalar(emitter, event);

        case YAML_SEQUENCE_START_EVENT:
            return yaml_emitter_emit_sequence_start(emitter, event);

        case YAML_MAPPING_START_EVENT:
            return yaml_emitter_emit_mapping_start(emitter, event);

        default:
            return yaml_emitter_set_emitter_error(emitter,
                    "expected SCALAR, SEQUENCE-START, MAPPING-START, or ALIAS");
    }

    return 0;
}